

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O0

bool Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::RescanObject
               (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *block,
               char *objectAddress,uint localObjectSize,uint objectIndex,Recycler *recycler)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  ushort uVar4;
  byte *pbVar5;
  undefined4 *puVar6;
  uchar attributes;
  Recycler *recycler_local;
  uint objectIndex_local;
  uint localObjectSize_local;
  char *objectAddress_local;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *block_local;
  
  pbVar5 = SmallHeapBlockT<MediumAllocationBlockAttributes>::ObjectInfo
                     ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)block,objectIndex);
  bVar1 = *pbVar5;
  bVar3 = HeapBlock::IsAnyFinalizableBlock((HeapBlock *)block);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x166,"(block->IsAnyFinalizableBlock())","block->IsAnyFinalizableBlock()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((bVar1 & 0x20) == 0) {
    uVar4 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAddressIndex
                      ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)block,objectAddress);
    if (uVar4 == 0xffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x16a,
                         "(block->GetAddressIndex(objectAddress) != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)"
                         ,
                         "block->GetAddressIndex(objectAddress) != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar3 = Recycler::AddMark(recycler,objectAddress,(ulong)localObjectSize);
    if (!bVar3) {
      return false;
    }
    (recycler->collectionStats).markData.rescanObjectCount =
         (recycler->collectionStats).markData.rescanObjectCount + 1;
    (recycler->collectionStats).markData.rescanObjectByteCount =
         (ulong)localObjectSize + (recycler->collectionStats).markData.rescanObjectByteCount;
  }
  if ((bVar1 & 0x14) == 0x14) {
    bVar3 = RescanTrackedObject(block,(FinalizableObject *)objectAddress,objectIndex,recycler);
    if (!bVar3) {
      return false;
    }
  }
  else if ((bVar1 & 0x80) != 0) {
    if ((bVar1 & 4) != 0) {
      (recycler->collectionStats).finalizeCount = (recycler->collectionStats).finalizeCount + 1;
    }
    pbVar5 = SmallHeapBlockT<MediumAllocationBlockAttributes>::ObjectInfo
                       ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)block,objectIndex);
    *pbVar5 = *pbVar5 & 0xfb;
  }
  return true;
}

Assistant:

bool
SmallFinalizableHeapBlockT<TBlockAttributes>::RescanObject(SmallFinalizableHeapBlockT<TBlockAttributes> * block, __in_ecount(localObjectSize) char * objectAddress, uint localObjectSize,
    uint objectIndex, Recycler * recycler)
{
    unsigned char const attributes = block->ObjectInfo(objectIndex);
    Assert(block->IsAnyFinalizableBlock());

    if ((attributes & LeafBit) == 0)
    {
        Assert(block->GetAddressIndex(objectAddress) != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);

        if (!recycler->AddMark(objectAddress, localObjectSize))
        {
            // Failed to add to the mark stack due to OOM.
            return false;
        }

        RECYCLER_STATS_INC(recycler, markData.rescanObjectCount);
        RECYCLER_STATS_ADD(recycler, markData.rescanObjectByteCount, localObjectSize);
    }

    // Since we mark through unallocated objects, we might have marked an object before it
    // is allocated as a tracked object. The object will not be queue up in the
    // tracked object list, and NewTrackBit will still be on. Queue it up now.

    // NewTrackBit will also be on for tracked object that we weren't able to queue
    // because of OOM.  In those case, the page is forced to be rescan, and we will
    // try to process those again here.
    if ((attributes & (TrackBit | NewTrackBit)) == (TrackBit | NewTrackBit))
    {
        if (!block->RescanTrackedObject((FinalizableObject*) objectAddress, objectIndex, recycler))
        {
            // Failed to add to the mark stack due to OOM.
            return false;
        }
    }
#ifdef RECYCLER_STATS
    else if (attributes & FinalizeBit)
    {
        // Concurrent thread mark the object before the attribute is set and missed the finalize count
        // For finalized object, we will always write a dummy vtable before returning to the call,
        // so the page will always need to be rescanned, and we can count those here.

        // NewFinalizeBit is cleared if the background thread has already counted the object.
        // So if it is still set here, we need to count it

        RECYCLER_STATS_INC_IF(attributes & NewFinalizeBit, recycler, finalizeCount);
        block->ObjectInfo(objectIndex) &= ~NewFinalizeBit;
    }
#endif

    return true;
}